

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O1

shared_ptr<chrono::ChLinkMotorRotationTorque> __thiscall
chrono::curiosity::AddMotorTorque
          (curiosity *this,shared_ptr<chrono::ChBody> *body1,shared_ptr<chrono::ChBody> *body2,
          shared_ptr<chrono::curiosity::CuriosityChassis> *chassis,ChVector<double> *rel_pos,
          ChQuaternion<double> *rel_rot)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long *plVar4;
  element_type *peVar5;
  ChFrameMoving<double> *Fa;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  shared_ptr<chrono::ChLinkMotorRotationTorque> sVar7;
  ChFrame<double> X_GC;
  undefined8 local_210;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_208;
  element_type *local_200;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1f8;
  element_type *local_1f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e8;
  shared_ptr<chrono::curiosity::CuriosityChassis> *local_1e0;
  shared_ptr<chrono::ChBody> *local_1d8;
  shared_ptr<chrono::ChBody> *local_1d0;
  ChFrame<double> local_1c8;
  ChFrame<double> local_140;
  undefined **local_b8;
  double local_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double dStack_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double dStack_68;
  double dStack_60;
  double dStack_58;
  double dStack_50;
  double dStack_48;
  double dStack_40;
  double local_38;
  
  peVar1 = (chassis->
           super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar2 = (peVar1->super_CuriosityPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (peVar1->super_CuriosityPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_1e0 = chassis;
  local_1d8 = body1;
  local_1d0 = body2;
  Fa = (ChFrameMoving<double> *)(**(code **)(*(long *)peVar2 + 0x1f0))();
  local_140._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
  local_140.coord.pos.m_data[0] = rel_pos->m_data[0];
  local_140.coord.pos.m_data[1] = rel_pos->m_data[1];
  local_140.coord.pos.m_data[2] = rel_pos->m_data[2];
  local_140.coord.rot.m_data[0] = rel_rot->m_data[0];
  local_140.coord.rot.m_data[1] = rel_rot->m_data[1];
  local_140.coord.rot.m_data[2] = rel_rot->m_data[2];
  local_140.coord.rot.m_data[3] = rel_rot->m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_140.Amatrix,rel_rot);
  operator*(&local_1c8,Fa,&local_140);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChLinkMotorRotationTorque,std::allocator<chrono::ChLinkMotorRotationTorque>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),
             (ChLinkMotorRotationTorque **)this,
             (allocator<chrono::ChLinkMotorRotationTorque> *)&local_140);
  plVar4 = *(long **)this;
  local_1f0 = (local_1d8->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (local_1f0 != (element_type *)0x0) {
    local_1f0 = local_1f0 + 0x78;
  }
  local_1e8 = (local_1d8->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
  if (local_1e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_1e8->_M_use_count = local_1e8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_1e8->_M_use_count = local_1e8->_M_use_count + 1;
    }
  }
  peVar5 = (local_1d0->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_200 = peVar5 + 0x78;
  if (peVar5 == (element_type *)0x0) {
    local_200 = (element_type *)0x0;
  }
  local_1f8 = (local_1d0->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
  if (local_1f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_1f8->_M_use_count = local_1f8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_1f8->_M_use_count = local_1f8->_M_use_count + 1;
    }
  }
  local_b8 = &PTR__ChFrame_0017db90;
  local_b0 = local_1c8.coord.pos.m_data[0];
  local_a8 = local_1c8.coord.pos.m_data[1];
  dStack_a0 = local_1c8.coord.pos.m_data[2];
  local_98 = local_1c8.coord.rot.m_data[0];
  dStack_90 = local_1c8.coord.rot.m_data[1];
  dStack_88 = local_1c8.coord.rot.m_data[2];
  dStack_80 = local_1c8.coord.rot.m_data[3];
  local_78 = local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  dStack_70 = local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
  ;
  dStack_68 = local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
  ;
  dStack_60 = local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
  ;
  dStack_58 = local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
  ;
  dStack_50 = local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]
  ;
  dStack_48 = local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
  ;
  dStack_40 = local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]
  ;
  local_38 = local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  (**(code **)(*plVar4 + 0x240))(plVar4,&local_1f0,&local_200);
  if (local_1f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f8);
  }
  if (local_1e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e8);
  }
  peVar1 = (local_1e0->
           super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar2 = (peVar1->super_CuriosityPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (peVar1->super_CuriosityPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  plVar4 = *(long **)(peVar2 + 0x38);
  local_210 = *(undefined8 *)this;
  local_208 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  if (local_208 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_208->_M_use_count = local_208->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_208->_M_use_count = local_208->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar4 + 0x138))(plVar4,&local_210);
  _Var6._M_pi = extraout_RDX;
  if (local_208 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_208);
    _Var6._M_pi = extraout_RDX_00;
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    _Var6._M_pi = extraout_RDX_01;
  }
  sVar7.super___shared_ptr<chrono::ChLinkMotorRotationTorque,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  sVar7.super___shared_ptr<chrono::ChLinkMotorRotationTorque,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChLinkMotorRotationTorque>)
         sVar7.super___shared_ptr<chrono::ChLinkMotorRotationTorque,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChLinkMotorRotationTorque> AddMotorTorque(std::shared_ptr<ChBody> body1,
                                                          std::shared_ptr<ChBody> body2,
                                                          std::shared_ptr<CuriosityChassis> chassis,
                                                          const ChVector<>& rel_pos,
                                                          const ChQuaternion<>& rel_rot) {
    // Express relative frame in global
    ChFrame<> X_GC = chassis->GetBody()->GetFrame_REF_to_abs() * ChFrame<>(rel_pos, rel_rot);

    // Create motor (actuated DOF about Z axis of X_GC frame)
    auto motor = chrono_types::make_shared<ChLinkMotorRotationTorque>();
    motor->Initialize(body1, body2, X_GC);
    chassis->GetBody()->GetSystem()->AddLink(motor);

    return motor;
}